

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusbar.cpp
# Opt level: O3

int __thiscall QStatusBar::insertWidget(QStatusBar *this,int index,QWidget *widget,int stretch)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  char local_60 [24];
  char *local_48;
  SBItem local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (widget == (QWidget *)0x0) {
    index = -1;
  }
  else {
    lVar1 = *(long *)&(this->super_QWidget).field_0x8;
    local_40.category = Normal;
    uVar2 = *(ulong *)(lVar1 + 0x268);
    uVar5 = (int)uVar2 - 1;
    uVar4 = 0xffffffff;
    if ((int)uVar5 < -1) {
      uVar4 = uVar5;
    }
    uVar8 = uVar2 & 0xffffffff;
    uVar6 = uVar2;
    do {
      uVar6 = uVar6 - 1;
      uVar7 = (int)uVar8 - 1;
      uVar8 = (ulong)uVar7;
      uVar5 = uVar4;
      if ((int)uVar7 < 0) break;
      uVar5 = uVar7;
    } while (*(int *)(*(long *)(lVar1 + 0x260) + 0xc + (ulong)((uint)uVar6 & 0x7fffffff) * 0x10) ==
             1);
    local_40.widget = widget;
    local_40.stretch = stretch;
    if (((index < 0) || (uVar2 < (uint)index)) || ((int)(uVar5 + 1) < index && -1 < (int)uVar5)) {
      local_60[0] = '\x02';
      local_60[1] = '\0';
      local_60[2] = '\0';
      local_60[3] = '\0';
      local_60[4] = '\0';
      local_60[5] = '\0';
      local_60[6] = '\0';
      local_60[7] = '\0';
      local_60[8] = '\0';
      local_60[9] = '\0';
      local_60[10] = '\0';
      local_60[0xb] = '\0';
      local_60[0xc] = '\0';
      local_60[0xd] = '\0';
      local_60[0xe] = '\0';
      local_60[0xf] = '\0';
      local_60[0x10] = '\0';
      local_60[0x11] = '\0';
      local_60[0x12] = '\0';
      local_60[0x13] = '\0';
      local_60[0x14] = '\0';
      local_60[0x15] = '\0';
      local_60[0x16] = '\0';
      local_60[0x17] = '\0';
      local_48 = "default";
      QMessageLogger::warning
                (local_60,"QStatusBar::insertWidget: Index out of range (%d), appending widget",
                 (ulong)(uint)index);
      index = uVar5 + 1;
    }
    QtPrivate::QMovableArrayOps<QStatusBarPrivate::SBItem>::
    emplace<QStatusBarPrivate::SBItem_const&>
              ((QMovableArrayOps<QStatusBarPrivate::SBItem> *)(lVar1 + 600),(long)index,&local_40);
    QList<QStatusBarPrivate::SBItem>::begin((QList<QStatusBarPrivate::SBItem> *)(lVar1 + 600));
    if (*(long *)(lVar1 + 0x280) != 0) {
      QWidget::hide(widget);
    }
    reformat(this);
    bVar3 = QWidgetPrivate::isExplicitlyHidden(*(QWidgetPrivate **)&widget->field_0x8);
    if (!bVar3) {
      QWidget::show(widget);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return index;
}

Assistant:

int QStatusBar::insertWidget(int index, QWidget *widget, int stretch)
{
    if (!widget)
        return -1;

    Q_D(QStatusBar);
    QStatusBarPrivate::SBItem item{widget, stretch, QStatusBarPrivate::Normal};

    int idx = d->indexToLastNonPermanentWidget();
    if (Q_UNLIKELY(index < 0 || index > d->items.size() || (idx >= 0 && index > idx + 1))) {
        qWarning("QStatusBar::insertWidget: Index out of range (%d), appending widget", index);
        index = idx + 1;
    }
    d->items.insert(index, item);

    if (!d->tempItem.isEmpty())
        widget->hide();

    reformat();
    if (!QWidgetPrivate::get(widget)->isExplicitlyHidden())
        widget->show();

    return index;
}